

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O3

Uint64 Diligent::GetStagingTextureLocationOffset
                 (TextureDesc *TexDesc,Uint32 ArraySlice,Uint32 MipLevel,Uint32 Alignment,
                 Uint32 LocationX,Uint32 LocationY,Uint32 LocationZ)

{
  RESOURCE_DIMENSION RVar1;
  Uint32 UVar2;
  Uint64 UVar3;
  TextureFormatAttribs *pTVar4;
  uint uVar5;
  undefined4 in_register_0000000c;
  char (*Args_1) [135];
  Uint32 UVar6;
  ulong uVar7;
  Uint32 UVar8;
  undefined4 in_register_00000084;
  Uint64 UVar9;
  bool bVar10;
  string msg;
  Uint32 local_94;
  string local_90;
  Uint32 local_6c;
  Uint32 local_68;
  Uint32 local_64;
  undefined1 local_60 [40];
  Uint64 local_38;
  
  Args_1 = (char (*) [135])CONCAT44(in_register_0000000c,Alignment);
  UVar8 = LocationX;
  if (TexDesc->MipLevels != 0) {
    RVar1 = TexDesc->Type;
    Args_1 = (char (*) [135])0x0;
    if ((RVar1 < 9) && ((0x1a8U >> (RVar1 & 0x1f) & 1) != 0)) {
      Args_1 = (char (*) [135])(ulong)((TexDesc->field_3).ArraySize == 0);
    }
    if (((((char)Args_1 == '\0') && (TexDesc->Width != 0)) && (TexDesc->Height != 0)) &&
       (TexDesc->Format != TEX_FORMAT_UNKNOWN)) goto LAB_0050f39e;
  }
  FormatString<char[26],char[135]>
            ((string *)local_60,(Diligent *)"Debug expression failed:\n",
             (char (*) [26])
             "TexDesc.MipLevels > 0 && TexDesc.GetArraySize() > 0 && TexDesc.Width > 0 && TexDesc.Height > 0 && TexDesc.Format != TEX_FORMAT_UNKNOWN"
             ,Args_1);
  DebugAssertionFailed
            ((Char *)CONCAT44(local_60._4_4_,local_60._0_4_),"GetStagingTextureLocationOffset",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
             ,0x93b);
  if ((undefined1 *)CONCAT44(local_60._4_4_,local_60._0_4_) != local_60 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_60._4_4_,local_60._0_4_),
                    CONCAT44(local_60._20_4_,local_60._16_4_) + 1);
  }
  RVar1 = TexDesc->Type;
LAB_0050f39e:
  uVar5 = 1;
  if ((RVar1 < RESOURCE_DIM_NUM_DIMENSIONS) && ((0x1a8U >> (RVar1 & 0x1f) & 1) != 0)) {
    uVar5 = (TexDesc->field_3).ArraySize;
  }
  if ((uVar5 <= ArraySlice) || (TexDesc->MipLevels <= MipLevel)) {
    UVar6 = 1;
    if ((RVar1 < RESOURCE_DIM_NUM_DIMENSIONS) && ((0x1a8U >> (RVar1 & 0x1f) & 1) != 0)) {
      UVar6 = (TexDesc->field_3).ArraySize;
    }
    if ((MipLevel != 0) || (UVar6 != ArraySlice)) {
      FormatString<char[26],char[125]>
                ((string *)local_60,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "ArraySlice < TexDesc.GetArraySize() && MipLevel < TexDesc.MipLevels || ArraySlice == TexDesc.GetArraySize() && MipLevel == 0"
                 ,(char (*) [125])(ulong)RVar1);
      DebugAssertionFailed
                ((Char *)CONCAT44(local_60._4_4_,local_60._0_4_),"GetStagingTextureLocationOffset",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x93c);
      if ((undefined1 *)CONCAT44(local_60._4_4_,local_60._0_4_) != local_60 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_60._4_4_,local_60._0_4_),
                        CONCAT44(local_60._20_4_,local_60._16_4_) + 1);
      }
    }
  }
  local_6c = LocationY;
  local_68 = LocationX;
  local_64 = ArraySlice;
  if (ArraySlice == 0) {
    UVar9 = 0;
  }
  else {
    UVar6 = 0;
    if (TexDesc->MipLevels == 0) {
      UVar9 = 0;
    }
    else {
      uVar5 = Alignment - (Alignment >> 1 & 0x55555555);
      uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333);
      UVar9 = 0;
      do {
        GetMipLevelProperties((MipLevelProperties *)local_60,TexDesc,UVar6);
        UVar3 = local_38;
        local_94 = Alignment;
        if (((uVar5 >> 4) + uVar5 & 0xf0f0f0f) * 0x1010101 >> 0x18 != 1) {
          FormatString<char[12],unsigned_int,char[23]>
                    (&local_90,(Diligent *)"Alignment (",(char (*) [12])&local_94,
                     (uint *)") must be a power of 2",
                     (char (*) [23])CONCAT44(in_register_00000084,UVar8));
          DebugAssertionFailed
                    (local_90._M_dataplus._M_p,"AlignUp",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/../../../Common/interface/Align.hpp"
                     ,0x34);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
        UVar9 = UVar9 + (~(ulong)(local_94 - 1) & UVar3 + (local_94 - 1));
        UVar6 = UVar6 + 1;
      } while (UVar6 < TexDesc->MipLevels);
    }
    if ((TexDesc->Type < 9) && ((0x1a8U >> (TexDesc->Type & 0x1f) & 1) != 0)) {
      UVar9 = UVar9 * local_64;
    }
  }
  if (MipLevel != 0) {
    uVar5 = Alignment - (Alignment >> 1 & 0x55555555);
    uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333);
    UVar6 = 0;
    do {
      GetMipLevelProperties((MipLevelProperties *)local_60,TexDesc,UVar6);
      UVar3 = local_38;
      local_94 = Alignment;
      if (((uVar5 >> 4) + uVar5 & 0xf0f0f0f) * 0x1010101 >> 0x18 != 1) {
        FormatString<char[12],unsigned_int,char[23]>
                  (&local_90,(Diligent *)"Alignment (",(char (*) [12])&local_94,
                   (uint *)") must be a power of 2",
                   (char (*) [23])CONCAT44(in_register_00000084,UVar8));
        DebugAssertionFailed
                  (local_90._M_dataplus._M_p,"AlignUp",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/../../../Common/interface/Align.hpp"
                   ,0x34);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
      }
      UVar9 = UVar9 + (~(ulong)(local_94 - 1) & UVar3 + (local_94 - 1));
      UVar6 = UVar6 + 1;
    } while (MipLevel != UVar6);
  }
  UVar2 = local_68;
  UVar6 = local_6c;
  UVar8 = 1;
  if ((TexDesc->Type < 9) && ((0x1a8U >> (TexDesc->Type & 0x1f) & 1) != 0)) {
    UVar8 = (TexDesc->field_3).ArraySize;
  }
  if (UVar8 == local_64) {
    if ((local_6c != 0 || local_68 != 0) || LocationZ != 0) {
      FormatString<char[60]>
                ((string *)local_60,
                 (char (*) [60])"Staging buffer size is requested: location must be (0,0,0).");
      DebugAssertionFailed
                ((Char *)CONCAT44(local_60._4_4_,local_60._0_4_),"GetStagingTextureLocationOffset",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x956);
      if ((undefined1 *)CONCAT44(local_60._4_4_,local_60._0_4_) != local_60 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_60._4_4_,local_60._0_4_),
                        CONCAT44(local_60._20_4_,local_60._16_4_) + 1);
      }
    }
  }
  else if ((local_6c != 0 || local_68 != 0) || LocationZ != 0) {
    GetMipLevelProperties((MipLevelProperties *)local_60,TexDesc,MipLevel);
    pTVar4 = GetTextureFormatAttribs(TexDesc->Format);
    if ((((uint)local_60._0_4_ <= UVar2) || ((uint)local_60._4_4_ <= UVar6)) ||
       ((uint)local_60._16_4_ <= LocationZ)) {
      FormatString<char[36]>(&local_90,(char (*) [36])"Specified location is out of bounds");
      DebugAssertionFailed
                (local_90._M_dataplus._M_p,"GetStagingTextureLocationOffset",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x95d);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    if (pTVar4->ComponentType == COMPONENT_TYPE_COMPRESSED) {
      if ((UVar2 % (uint)pTVar4->BlockWidth == 0) && (UVar6 % (uint)pTVar4->BlockHeight == 0)) {
        bVar10 = true;
      }
      else {
        FormatString<char[86]>
                  (&local_90,
                   (char (*) [86])
                   "For compressed texture formats, location must be a multiple of compressed block size."
                  );
        DebugAssertionFailed
                  (local_90._M_dataplus._M_p,"GetStagingTextureLocationOffset",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                   ,0x961);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        bVar10 = pTVar4->ComponentType == COMPONENT_TYPE_COMPRESSED;
      }
    }
    else {
      bVar10 = false;
    }
    uVar7 = 1;
    if (!bVar10) {
      uVar7 = (ulong)pTVar4->NumComponents;
    }
    UVar9 = UVar9 + uVar7 * pTVar4->ComponentSize * ((ulong)UVar2 / (ulong)pTVar4->BlockWidth) +
            ((ulong)(LocationZ * local_60._12_4_ + UVar6) / (ulong)pTVar4->BlockHeight) *
            local_60._24_8_;
  }
  return UVar9;
}

Assistant:

Uint64 GetStagingTextureLocationOffset(const TextureDesc& TexDesc,
                                       Uint32             ArraySlice,
                                       Uint32             MipLevel,
                                       Uint32             Alignment,
                                       Uint32             LocationX,
                                       Uint32             LocationY,
                                       Uint32             LocationZ)
{
    VERIFY_EXPR(TexDesc.MipLevels > 0 && TexDesc.GetArraySize() > 0 && TexDesc.Width > 0 && TexDesc.Height > 0 && TexDesc.Format != TEX_FORMAT_UNKNOWN);
    VERIFY_EXPR(ArraySlice < TexDesc.GetArraySize() && MipLevel < TexDesc.MipLevels || ArraySlice == TexDesc.GetArraySize() && MipLevel == 0);

    Uint64 Offset = 0;
    if (ArraySlice > 0)
    {
        Uint64 ArraySliceSize = 0;
        for (Uint32 mip = 0; mip < TexDesc.MipLevels; ++mip)
        {
            MipLevelProperties MipInfo = GetMipLevelProperties(TexDesc, mip);
            ArraySliceSize += AlignUp(MipInfo.MipSize, Alignment);
        }

        Offset = ArraySliceSize;
        if (TexDesc.IsArray())
            Offset *= ArraySlice;
    }

    for (Uint32 mip = 0; mip < MipLevel; ++mip)
    {
        MipLevelProperties MipInfo = GetMipLevelProperties(TexDesc, mip);
        Offset += AlignUp(MipInfo.MipSize, Alignment);
    }

    if (ArraySlice == TexDesc.GetArraySize())
    {
        VERIFY(LocationX == 0 && LocationY == 0 && LocationZ == 0,
               "Staging buffer size is requested: location must be (0,0,0).");
    }
    else if (LocationX != 0 || LocationY != 0 || LocationZ != 0)
    {
        const MipLevelProperties&   MipLevelAttribs = GetMipLevelProperties(TexDesc, MipLevel);
        const TextureFormatAttribs& FmtAttribs      = GetTextureFormatAttribs(TexDesc.Format);
        VERIFY(LocationX < MipLevelAttribs.LogicalWidth && LocationY < MipLevelAttribs.LogicalHeight && LocationZ < MipLevelAttribs.Depth,
               "Specified location is out of bounds");
        if (FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED)
        {
            VERIFY((LocationX % FmtAttribs.BlockWidth) == 0 && (LocationY % FmtAttribs.BlockHeight) == 0,
                   "For compressed texture formats, location must be a multiple of compressed block size.");
        }

        // For compressed-block formats, RowSize is the size of one compressed row.
        // For non-compressed formats, BlockHeight is 1.
        Offset += (LocationZ * MipLevelAttribs.StorageHeight + LocationY) / FmtAttribs.BlockHeight * MipLevelAttribs.RowSize;

        // For non-compressed formats, BlockWidth is 1.
        Offset += Uint64{LocationX / FmtAttribs.BlockWidth} * FmtAttribs.GetElementSize();

        // Note: this addressing complies with how Vulkan (as well as OpenGL/GLES and Metal) address
        // textures when copying data to/from buffers:
        //      address of (x,y,z) = bufferOffset + (((z * imageHeight) + y) * rowLength + x) * texelBlockSize; (18.4.1)
    }

    return Offset;
}